

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O2

char * __thiscall
MemoryLeakDetector::reallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  MemoryLeakDetectorNode *node;
  char *pcVar1;
  
  if (memory != (char *)0x0) {
    node = MemoryLeakDetectorTable::removeNode(&this->memoryTable_,memory);
    if (node == (MemoryLeakDetectorNode *)0x0) {
      MemoryLeakOutputStringBuffer::reportDeallocateNonAllocatedMemoryFailure
                (&this->outputBuffer_,file,line,allocator,this->reporter_);
      return (char *)0x0;
    }
    checkForCorruption(this,node,file,line,allocator,allocatNodesSeperately);
  }
  pcVar1 = reallocateMemoryAndLeakInformation
                     (this,allocator,memory,size,file,line,allocatNodesSeperately);
  return pcVar1;
}

Assistant:

char* MemoryLeakDetector::reallocMemory(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (memory) {
        MemoryLeakDetectorNode* node = memoryTable_.removeNode(memory);
        if (node == NULLPTR) {
            outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
            return NULLPTR;
        }
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
    }
    return reallocateMemoryAndLeakInformation(allocator, memory, size, file, line, allocatNodesSeperately);
}